

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

void __thiscall iqxmlrpc::Client_base::Impl::~Impl(Impl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client_connection *pCVar2;
  pointer pcVar3;
  
  pCVar2 = (this->conn_cache).px;
  if (pCVar2 != (Client_connection *)0x0) {
    (*pCVar2->_vptr_Client_connection[1])();
  }
  XHeaders::~XHeaders(&(this->opts).xheaders_);
  pcVar3 = (this->opts).auth_passwd_._M_dataplus._M_p;
  paVar1 = &(this->opts).auth_passwd_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->opts).auth_user_._M_dataplus._M_p;
  paVar1 = &(this->opts).auth_user_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->opts).vhost_._M_dataplus._M_p;
  paVar1 = &(this->opts).vhost_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->opts).uri_._M_dataplus._M_p;
  paVar1 = &(this->opts).uri_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->opts).addr_._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00188ef8;
  boost::detail::shared_count::~shared_count(&(this->opts).addr_.impl_.pn);
  return;
}

Assistant:

Impl(
    const iqnet::Inet_addr& addr,
    const std::string& uri,
    const std::string& vhost
  ):
    opts(addr, uri, vhost) {}